

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

void __thiscall
capnp::List<capnp::List<int,_(capnp::Kind)0>,_(capnp::Kind)6>::Builder::set
          (Builder *this,uint index,initializer_list<int> value)

{
  uint uVar1;
  const_iterator piVar2;
  int *element;
  const_iterator __end0;
  const_iterator __begin0;
  initializer_list<int> *__range3;
  undefined1 local_50 [4];
  uint i;
  Builder l;
  uint index_local;
  Builder *this_local;
  initializer_list<int> value_local;
  
  value_local._M_array = (iterator)value._M_len;
  this_local = (Builder *)value._M_array;
  l.builder._36_4_ = index;
  uVar1 = size(this);
  if (index < uVar1) {
    std::initializer_list<int>::size((initializer_list<int> *)&this_local);
    init((Builder *)local_50,(EVP_PKEY_CTX *)this);
    __range3._4_4_ = 0;
    __end0 = std::initializer_list<int>::begin((initializer_list<int> *)&this_local);
    piVar2 = std::initializer_list<int>::end((initializer_list<int> *)&this_local);
    for (; __end0 != piVar2; __end0 = __end0 + 1) {
      List<int,_(capnp::Kind)0>::Builder::set((Builder *)local_50,__range3._4_4_,*__end0);
      __range3._4_4_ = __range3._4_4_ + 1;
    }
    return;
  }
  kj::_::inlineRequireFailure
            ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/list.h"
             ,0x187,"index < size()","",(char *)0x0);
}

Assistant:

void set(uint index, std::initializer_list<ReaderFor<T>> value) {
      KJ_IREQUIRE(index < size());
      auto l = init(index, value.size());
      uint i = 0;
      for (auto& element: value) {
        l.set(i++, element);
      }
    }